

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error __thiscall asmjit::Logger::logBinary(Logger *this,void *data,size_t size)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  Error EVar4;
  ulong uVar5;
  long lVar6;
  char buffer [128];
  undefined4 local_b8;
  undefined2 local_b4;
  char acStack_b2 [130];
  
  local_b4 = 0x2061;
  local_b8 = 0x7461642e;
  do {
    if (size == 0) {
      return 0;
    }
    uVar5 = 0x10;
    if (size < 0x10) {
      uVar5 = size;
    }
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      bVar1 = *data;
      data = (void *)((long)data + 1);
      cVar2 = "0123456789ABCDEF"[bVar1 & 0xf];
      acStack_b2[lVar6] = "0123456789ABCDEF"[bVar1 >> 4];
      acStack_b2[lVar6 + 1] = cVar2;
      lVar3 = lVar6 + 2;
    } while ((int)uVar5 * 2 != (int)(lVar6 + 2));
    acStack_b2[lVar6 + 2] = '\n';
    size = size - uVar5;
    EVar4 = (*this->_vptr_Logger[2])(this,&local_b8,lVar6 + 9);
  } while (EVar4 == 0);
  return EVar4;
}

Assistant:

Error Logger::logBinary(const void* data, size_t size) noexcept {
  static const char prefix[] = ".data ";
  static const char hex[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };

  const uint8_t* s = static_cast<const uint8_t*>(data);
  size_t i = size;

  char buffer[128];
  ::memcpy(buffer, prefix, ASMJIT_ARRAY_SIZE(prefix) - 1);

  while (i) {
    uint32_t n = static_cast<uint32_t>(std::min<size_t>(i, 16));
    char* p = buffer + ASMJIT_ARRAY_SIZE(prefix) - 1;

    i -= n;
    do {
      uint32_t c = s[0];

      p[0] = hex[c >> 4];
      p[1] = hex[c & 15];

      p += 2;
      s += 1;
    } while (--n);

    *p++ = '\n';
    ASMJIT_PROPAGATE(log(buffer, (size_t)(p - buffer)));
  }

  return kErrorOk;
}